

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall Assimp::SMDImporter::ParseFile(SMDImporter *this)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  int iVar4;
  Logger *this_00;
  byte *pbVar5;
  char *szCurrent;
  byte *local_38;
  
  local_38 = (byte *)(this->mBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
LAB_005e9b84:
  uVar2 = this->iLineNumber;
  this->iLineNumber = uVar2 + 1;
  pbVar5 = local_38;
  while( true ) {
    bVar1 = *pbVar5;
    if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
    pbVar5 = pbVar5 + 1;
  }
  if (bVar1 == 0) {
    return;
  }
  local_38 = pbVar5;
  iVar4 = strncmp("version",(char *)pbVar5,7);
  pbVar3 = local_38;
  if (iVar4 == 0) {
    bVar1 = pbVar5[7];
    if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_005e9bd3;
    local_38 = pbVar5 + 8;
    if (bVar1 == 0) {
      local_38 = pbVar5 + 7;
    }
    for (; (bVar1 = *local_38, bVar1 == 0x20 || (bVar1 == 9)); local_38 = local_38 + 1) {
    }
    if ((bVar1 < 0xe) && ((0x3401U >> (bVar1 & 0x1f) & 1) != 0)) {
      return;
    }
    if (0xf5 < (byte)(bVar1 - 0x3a)) goto LAB_005e9d7f;
    goto LAB_005e9da9;
  }
LAB_005e9bd3:
  iVar4 = strncmp("nodes",(char *)local_38,5);
  pbVar5 = local_38;
  if (iVar4 == 0) {
    bVar1 = pbVar3[5];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      local_38 = pbVar3 + 6;
      if (bVar1 == 0) {
        local_38 = pbVar3 + 5;
      }
      ParseNodesSection(this,(char *)local_38,(char **)&local_38);
      goto LAB_005e9b84;
    }
  }
  iVar4 = strncmp("triangles",(char *)local_38,9);
  pbVar3 = local_38;
  if (iVar4 == 0) {
    bVar1 = pbVar5[9];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      local_38 = pbVar5 + 10;
      if (bVar1 == 0) {
        local_38 = pbVar5 + 9;
      }
      ParseTrianglesSection(this,(char *)local_38,(char **)&local_38);
      goto LAB_005e9b84;
    }
  }
  iVar4 = strncmp("vertexanimation",(char *)local_38,0xf);
  pbVar5 = local_38;
  if (iVar4 == 0) {
    bVar1 = pbVar3[0xf];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      local_38 = pbVar3 + 0x10;
      if (bVar1 == 0) {
        local_38 = pbVar3 + 0xf;
      }
      this->bHasUVs = false;
      ParseVASection(this,(char *)local_38,(char **)&local_38);
      goto LAB_005e9b84;
    }
  }
  iVar4 = strncmp("skeleton",(char *)local_38,8);
  if (iVar4 == 0) {
    bVar1 = pbVar5[8];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      local_38 = pbVar5 + 9;
      if (bVar1 == 0) {
        local_38 = pbVar5 + 8;
      }
      ParseSkeletonSection(this,(char *)local_38,(char **)&local_38);
      goto LAB_005e9b84;
    }
  }
  while ((0xd < *local_38 || ((0x2401U >> (*local_38 & 0x1f) & 1) == 0))) {
    local_38 = local_38 + 1;
  }
  for (; (*local_38 == 0xd || (*local_38 == 10)); local_38 = local_38 + 1) {
  }
  this->iLineNumber = uVar2 + 2;
  goto LAB_005e9b84;
LAB_005e9d7f:
  iVar4 = 0;
  do {
    iVar4 = (uint)(byte)(bVar1 - 0x30) + iVar4 * 10;
    bVar1 = local_38[1];
    local_38 = local_38 + 1;
  } while (0xf5 < (byte)(bVar1 - 0x3a));
  if (iVar4 != 1) {
LAB_005e9da9:
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,
                 "SMD.version is not 1. This file format is not known. Continuing happily ...");
  }
  goto LAB_005e9b84;
}

Assistant:

void SMDImporter::ParseFile() {
    const char* szCurrent = &mBuffer[0];

    // read line per line ...
    for ( ;; ) {
        if(!SkipSpacesAndLineEnd(szCurrent,&szCurrent)) {
            break;
        }

        // "version <n> \n", <n> should be 1 for hl and hl2 SMD files
        if (TokenMatch(szCurrent,"version",7)) {
            if(!SkipSpaces(szCurrent,&szCurrent)) break;
            if (1 != strtoul10(szCurrent,&szCurrent)) {
                ASSIMP_LOG_WARN("SMD.version is not 1. This "
                    "file format is not known. Continuing happily ...");
            }
            continue;
        }
        // "nodes\n" - Starts the node section
        if (TokenMatch(szCurrent,"nodes",5)) {
            ParseNodesSection(szCurrent,&szCurrent);
            continue;
        }
        // "triangles\n" - Starts the triangle section
        if (TokenMatch(szCurrent,"triangles",9)) {
            ParseTrianglesSection(szCurrent,&szCurrent);
            continue;
        }
        // "vertexanimation\n" - Starts the vertex animation section
        if (TokenMatch(szCurrent,"vertexanimation",15)) {
            bHasUVs = false;
            ParseVASection(szCurrent,&szCurrent);
            continue;
        }
        // "skeleton\n" - Starts the skeleton section
        if (TokenMatch(szCurrent,"skeleton",8)) {
            ParseSkeletonSection(szCurrent,&szCurrent);
            continue;
        }
        SkipLine(szCurrent,&szCurrent);
    }
}